

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int mbedtls_x509_get_rsassa_pss_params
              (mbedtls_x509_buf *params,mbedtls_md_type_t *md_alg,mbedtls_md_type_t *mgf_md,
              int *salt_len)

{
  int iVar1;
  int iVar2;
  uchar *end;
  uchar *puVar3;
  uchar *p;
  size_t len;
  int trailer_field;
  mbedtls_x509_buf alg_id;
  mbedtls_x509_buf alg_params;
  uchar *local_70;
  size_t local_68;
  int local_5c;
  mbedtls_asn1_buf local_58;
  mbedtls_asn1_buf local_40;
  
  *md_alg = MBEDTLS_MD_SHA1;
  *mgf_md = MBEDTLS_MD_SHA1;
  *salt_len = 0x14;
  if (params->tag != 0x30) {
    return -0x2362;
  }
  local_70 = params->p;
  if (params->len == 0) {
    return 0;
  }
  end = local_70 + params->len;
  iVar1 = mbedtls_asn1_get_tag(&local_70,end,&local_68,0xa0);
  if (iVar1 == 0) {
    puVar3 = local_70 + local_68;
    iVar2 = mbedtls_asn1_get_alg_null(&local_70,puVar3,&local_58);
    iVar1 = iVar2 + -0x2300;
    if (iVar2 == 0) {
      iVar1 = 0;
    }
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = mbedtls_oid_get_md_alg(&local_58,md_alg);
    if (iVar1 != 0) goto LAB_001808bb;
    if (local_70 != puVar3) {
      return -0x2366;
    }
  }
  else {
    puVar3 = local_70;
    if (iVar1 != -0x62) goto LAB_001808bb;
  }
  if (puVar3 == end) {
    return 0;
  }
  iVar1 = mbedtls_asn1_get_tag(&local_70,end,&local_68,0xa1);
  if (iVar1 == 0) {
    puVar3 = local_70 + local_68;
    iVar2 = mbedtls_asn1_get_alg(&local_70,puVar3,&local_58,&local_40);
    iVar1 = iVar2 + -0x2300;
    if (iVar2 == 0) {
      iVar1 = 0;
    }
    if (iVar1 != 0) {
      return iVar1;
    }
    if (local_58.len != 9) {
      return -0x20ae;
    }
    if ((char)*(long *)((long)local_58.p + 8) != '\b' || *(long *)local_58.p != 0x1010df78648862a) {
      return -0x20ae;
    }
    iVar1 = x509_get_hash_alg(&local_40,mgf_md);
    if (iVar1 != 0) {
      return iVar1;
    }
    if (local_70 != puVar3) {
      return -0x2366;
    }
  }
  else {
    puVar3 = local_70;
    if (iVar1 != -0x62) goto LAB_001808bb;
  }
  if (puVar3 == end) {
    return 0;
  }
  iVar1 = mbedtls_asn1_get_tag(&local_70,end,&local_68,0xa2);
  if (iVar1 == 0) {
    puVar3 = local_70 + local_68;
    iVar1 = mbedtls_asn1_get_int(&local_70,puVar3,salt_len);
    if (iVar1 != 0) goto LAB_001808bb;
    if (local_70 != puVar3) {
      return -0x2366;
    }
  }
  else {
    puVar3 = local_70;
    if (iVar1 != -0x62) goto LAB_001808bb;
  }
  if (puVar3 == end) {
    return 0;
  }
  iVar1 = mbedtls_asn1_get_tag(&local_70,end,&local_68,0xa3);
  if (iVar1 == 0) {
    puVar3 = local_70 + local_68;
    iVar1 = mbedtls_asn1_get_int(&local_70,puVar3,&local_5c);
    if (iVar1 == 0) {
      if (local_70 != puVar3) {
        return -0x2366;
      }
      local_70 = puVar3;
      if (local_5c != 1) {
        return -0x2300;
      }
      goto LAB_00180868;
    }
  }
  else if (iVar1 == -0x62) {
LAB_00180868:
    if (local_70 == end) {
      return 0;
    }
    return -0x2366;
  }
LAB_001808bb:
  return iVar1 + -0x2300;
}

Assistant:

int mbedtls_x509_get_rsassa_pss_params( const mbedtls_x509_buf *params,
                                mbedtls_md_type_t *md_alg, mbedtls_md_type_t *mgf_md,
                                int *salt_len )
{
    int ret;
    unsigned char *p;
    const unsigned char *end, *end2;
    size_t len;
    mbedtls_x509_buf alg_id, alg_params;

    /* First set everything to defaults */
    *md_alg = MBEDTLS_MD_SHA1;
    *mgf_md = MBEDTLS_MD_SHA1;
    *salt_len = 20;

    /* Make sure params is a SEQUENCE and setup bounds */
    if( params->tag != ( MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) )
        return( MBEDTLS_ERR_X509_INVALID_ALG +
                MBEDTLS_ERR_ASN1_UNEXPECTED_TAG );

    p = (unsigned char *) params->p;
    end = p + params->len;

    if( p == end )
        return( 0 );

    /*
     * HashAlgorithm
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                    MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 0 ) ) == 0 )
    {
        end2 = p + len;

        /* HashAlgorithm ::= AlgorithmIdentifier (without parameters) */
        if( ( ret = mbedtls_x509_get_alg_null( &p, end2, &alg_id ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_oid_get_md_alg( &alg_id, md_alg ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

        if( p != end2 )
            return( MBEDTLS_ERR_X509_INVALID_ALG +
                    MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }
    else if( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

    if( p == end )
        return( 0 );

    /*
     * MaskGenAlgorithm
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                    MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 1 ) ) == 0 )
    {
        end2 = p + len;

        /* MaskGenAlgorithm ::= AlgorithmIdentifier (params = HashAlgorithm) */
        if( ( ret = mbedtls_x509_get_alg( &p, end2, &alg_id, &alg_params ) ) != 0 )
            return( ret );

        /* Only MFG1 is recognised for now */
        if( MBEDTLS_OID_CMP( MBEDTLS_OID_MGF1, &alg_id ) != 0 )
            return( MBEDTLS_ERR_X509_FEATURE_UNAVAILABLE +
                    MBEDTLS_ERR_OID_NOT_FOUND );

        /* Parse HashAlgorithm */
        if( ( ret = x509_get_hash_alg( &alg_params, mgf_md ) ) != 0 )
            return( ret );

        if( p != end2 )
            return( MBEDTLS_ERR_X509_INVALID_ALG +
                    MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }
    else if( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

    if( p == end )
        return( 0 );

    /*
     * salt_len
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                    MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 2 ) ) == 0 )
    {
        end2 = p + len;

        if( ( ret = mbedtls_asn1_get_int( &p, end2, salt_len ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

        if( p != end2 )
            return( MBEDTLS_ERR_X509_INVALID_ALG +
                    MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );
    }
    else if( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

    if( p == end )
        return( 0 );

    /*
     * trailer_field (if present, must be 1)
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
                    MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | 3 ) ) == 0 )
    {
        int trailer_field;

        end2 = p + len;

        if( ( ret = mbedtls_asn1_get_int( &p, end2, &trailer_field ) ) != 0 )
            return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

        if( p != end2 )
            return( MBEDTLS_ERR_X509_INVALID_ALG +
                    MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

        if( trailer_field != 1 )
            return( MBEDTLS_ERR_X509_INVALID_ALG );
    }
    else if( ret != MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
        return( MBEDTLS_ERR_X509_INVALID_ALG + ret );

    if( p != end )
        return( MBEDTLS_ERR_X509_INVALID_ALG +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    return( 0 );
}